

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

void end_examples<sparse_parameters>(lda *l,sparse_parameters *weights)

{
  float *pfVar1;
  _Hash_node_base *p_Var2;
  vw *pvVar3;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  float fVar6;
  
  p_Var5 = (weights->_map)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    pvVar3 = l->all;
    do {
      pfVar1 = (l->decay_levels)._end;
      fVar6 = expf(pfVar1[-1] -
                   pfVar1[(int)((double)*(float *)((long)&(p_Var5[2]._M_nxt)->_M_nxt +
                                                  (ulong)pvVar3->lda * 4) + (-1.0 - l->example_t))])
      ;
      if (1.0 <= fVar6) {
        fVar6 = 1.0;
      }
      pvVar3 = l->all;
      if (pvVar3->lda != 0) {
        p_Var2 = p_Var5[2]._M_nxt;
        uVar4 = 0;
        do {
          *(float *)((long)&p_Var2->_M_nxt + uVar4 * 4) =
               *(float *)((long)&p_Var2->_M_nxt + uVar4 * 4) * fVar6;
          uVar4 = uVar4 + 1;
          pvVar3 = l->all;
        } while (uVar4 < pvVar3->lda);
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void end_examples(lda &l, T &weights)
{
  for (typename T::iterator iter = weights.begin(); iter != weights.end(); ++iter)
  {
    float decay_component =
        l.decay_levels.last() - l.decay_levels.end()[(int)(-1 - l.example_t + (&(*iter))[l.all->lda])];
    float decay = fmin(1.f, correctedExp(decay_component));

    weight *wp = &(*iter);
    for (size_t i = 0; i < l.all->lda; ++i) wp[i] *= decay;
  }
}